

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

bool __thiscall PPointer::ReadValue(PPointer *this,FSerializer *ar,char *key,void *addr)

{
  PType *pPVar1;
  PClass *pPVar2;
  int iVar3;
  undefined4 extraout_var;
  PClass *pPVar4;
  bool bVar5;
  bool res;
  bool local_29;
  
  pPVar2 = PClass::RegistrationInfo.MyClass;
  pPVar1 = this->PointedType;
  if ((pPVar1->super_PTypeBase).super_DObject.Class == (PClass *)0x0) {
    iVar3 = (**(pPVar1->super_PTypeBase).super_DObject._vptr_DObject)(pPVar1);
    (pPVar1->super_PTypeBase).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar3);
  }
  pPVar4 = (pPVar1->super_PTypeBase).super_DObject.Class;
  bVar5 = pPVar4 != (PClass *)0x0;
  if (pPVar4 != pPVar2 && bVar5) {
    do {
      pPVar4 = pPVar4->ParentClass;
      bVar5 = pPVar4 != (PClass *)0x0;
      if (pPVar4 == pPVar2) break;
    } while (pPVar4 != (PClass *)0x0);
  }
  if (bVar5) {
    local_29 = false;
    ::Serialize(ar,key,(DObject **)addr,(DObject **)0x0,&local_29);
  }
  else {
    local_29 = false;
  }
  return local_29;
}

Assistant:

bool PPointer::ReadValue(FSerializer &ar, const char *key, void *addr) const
{
	if (PointedType->IsKindOf(RUNTIME_CLASS(PClass)))
	{
		bool res = false;
		::Serialize(ar, key, *(DObject **)addr, nullptr, &res);
		return res;
	}
	return false;
}